

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_2401980::MemPoolAccept::CheckFeeRate
          (MemPoolAccept *this,size_t package_size,CAmount package_fee,TxValidationState *state)

{
  CAmount CVar1;
  ValidationState<TxValidationResult> *in_RCX;
  long *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  CAmount mempoolRejectFee;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  CTxMemPool *in_stack_fffffffffffffed0;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  undefined1 in_stack_fffffffffffffedf;
  undefined8 in_stack_fffffffffffffee0;
  TxValidationResult TVar2;
  ValidationState<TxValidationResult> *in_stack_fffffffffffffee8;
  long *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  allocator<char> *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  allocator<char> *__s;
  bool local_b1;
  allocator<char> local_a2;
  allocator<char> local_a1;
  CAmount local_a0;
  CAmount local_98;
  long *local_90;
  long local_8;
  
  TVar2 = (TxValidationResult)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_90 = in_RDX;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)CONCAT17(in_stack_fffffffffffffedf,
                              CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
             (char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
             (AnnotatedMixin<std::recursive_mutex> *)0x14b7108);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)CONCAT17(in_stack_fffffffffffffedf,
                              CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
             (char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
             (AnnotatedMixin<std::recursive_mutex> *)0x14b712c);
  local_a0 = (CAmount)CTxMemPool::GetMinFee(in_stack_fffffffffffffed0);
  local_98 = CFeeRate::GetFee((CFeeRate *)in_stack_fffffffffffffee8,TVar2);
  if ((local_98 < 1) || (local_98 <= (long)local_90)) {
    CVar1 = CFeeRate::GetFee((CFeeRate *)in_stack_fffffffffffffee8,TVar2);
    if ((long)local_90 < CVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_RDI,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      CVar1 = CFeeRate::GetFee((CFeeRate *)in_RCX,TVar2);
      TVar2 = (TxValidationResult)((ulong)CVar1 >> 0x20);
      tinyformat::format<long,long>
                ((char *)in_stack_ffffffffffffff08,
                 (long *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),local_90);
      local_b1 = ValidationState<TxValidationResult>::Invalid
                           (in_RCX,TVar2,
                            (string *)
                            CONCAT17(in_stack_fffffffffffffedf,
                                     CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
                            (string *)in_stack_fffffffffffffed0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      std::allocator<char>::~allocator(&local_a2);
    }
    else {
      local_b1 = true;
    }
  }
  else {
    __s = &local_a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_RDI,(char *)__s,(allocator<char> *)in_RCX)
    ;
    tinyformat::format<long,long>
              ((char *)in_RCX,(long *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    local_b1 = ValidationState<TxValidationResult>::Invalid
                         (in_stack_fffffffffffffee8,TVar2,
                          (string *)
                          CONCAT17(in_stack_fffffffffffffedf,
                                   CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),
                          (string *)in_stack_fffffffffffffed0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    std::allocator<char>::~allocator(&local_a1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_b1;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main, m_pool.cs)
    {
        AssertLockHeld(::cs_main);
        AssertLockHeld(m_pool.cs);
        CAmount mempoolRejectFee = m_pool.GetMinFee().GetFee(package_size);
        if (mempoolRejectFee > 0 && package_fee < mempoolRejectFee) {
            return state.Invalid(TxValidationResult::TX_RECONSIDERABLE, "mempool min fee not met", strprintf("%d < %d", package_fee, mempoolRejectFee));
        }

        if (package_fee < m_pool.m_opts.min_relay_feerate.GetFee(package_size)) {
            return state.Invalid(TxValidationResult::TX_RECONSIDERABLE, "min relay fee not met",
                                 strprintf("%d < %d", package_fee, m_pool.m_opts.min_relay_feerate.GetFee(package_size)));
        }
        return true;
    }